

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LocalGraph.cpp
# Opt level: O0

void __thiscall
wasm::LocalGraphFlower::computeSetInfluences
          (LocalGraphFlower *this,LocalSet *set,SetInfluencesMap *setInfluences)

{
  uint uVar1;
  bool bVar2;
  size_type sVar3;
  reference pvVar4;
  size_type sVar5;
  reference this_00;
  reference ppLVar6;
  reference ppLVar7;
  SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
  *this_01;
  value_type *ppLVar8;
  mapped_type *this_02;
  value_type local_d8;
  LocalSet *set_2;
  Iterator __end3;
  Iterator __begin3;
  mapped_type *__range3;
  LocalGet *get_1;
  iterator __end2_2;
  iterator __begin2_2;
  value_type *__range2_2;
  LocalSet *set_1;
  iterator __end2_1;
  iterator __begin2_1;
  value_type *__range2_1;
  LocalGet *get;
  iterator __end2;
  iterator __begin2;
  value_type *__range2;
  Index index;
  SetInfluencesMap *setInfluences_local;
  LocalSet *set_local;
  LocalGraphFlower *this_local;
  
  uVar1 = set->index;
  setInfluences_local = (SetInfluencesMap *)set;
  set_local = (LocalSet *)this;
  sVar3 = std::
          unordered_map<wasm::LocalSet_*,_std::unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>,_std::hash<wasm::LocalSet_*>,_std::equal_to<wasm::LocalSet_*>,_std::allocator<std::pair<wasm::LocalSet_*const,_std::unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>_>_>_>
          ::count(setInfluences,(key_type *)&setInfluences_local);
  if (sVar3 != 0) {
    __assert_fail("!setInfluences.count(set)",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/LocalGraph.cpp"
                  ,0x19c,
                  "void wasm::LocalGraphFlower::computeSetInfluences(LocalSet *, LocalGraphBase::SetInfluencesMap &)"
                 );
  }
  pvVar4 = std::
           vector<std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>,_std::allocator<std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>_>_>
           ::operator[](&this->getsByIndex,(ulong)uVar1);
  __end2 = std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>::begin(pvVar4);
  get = (LocalGet *)std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>::end(pvVar4);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<wasm::LocalGet_**,_std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>_>
                                *)&get);
    if (!bVar2) break;
    ppLVar7 = __gnu_cxx::
              __normal_iterator<wasm::LocalGet_**,_std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>_>
              ::operator*(&__end2);
    __range2_1 = (value_type *)*ppLVar7;
    sVar5 = std::
            unordered_map<wasm::LocalGet_*,_wasm::SmallSet<wasm::LocalSet_*,_2UL>,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>_>_>
            ::count(this->getSetsMap,(key_type *)&__range2_1);
    if (sVar5 == 0) {
      computeGetSets(this,(LocalGet *)__range2_1);
    }
    __gnu_cxx::
    __normal_iterator<wasm::LocalGet_**,_std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>_>
    ::operator++(&__end2);
  }
  this_00 = std::
            vector<std::vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>,_std::allocator<std::vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>_>_>
            ::operator[](&this->setsByIndex,(ulong)uVar1);
  __end2_1 = std::vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>::begin(this_00);
  set_1 = (LocalSet *)std::vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>::end(this_00)
  ;
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end2_1,
                       (__normal_iterator<wasm::LocalSet_**,_std::vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>_>
                        *)&set_1);
    if (!bVar2) break;
    ppLVar6 = __gnu_cxx::
              __normal_iterator<wasm::LocalSet_**,_std::vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>_>
              ::operator*(&__end2_1);
    __range2_2 = (value_type *)*ppLVar6;
    std::
    unordered_map<wasm::LocalSet_*,_std::unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>,_std::hash<wasm::LocalSet_*>,_std::equal_to<wasm::LocalSet_*>,_std::allocator<std::pair<wasm::LocalSet_*const,_std::unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>_>_>_>
    ::operator[](setInfluences,(key_type *)&__range2_2);
    __gnu_cxx::
    __normal_iterator<wasm::LocalSet_**,_std::vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>_>
    ::operator++(&__end2_1);
  }
  std::
  unordered_map<wasm::LocalSet_*,_std::unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>,_std::hash<wasm::LocalSet_*>,_std::equal_to<wasm::LocalSet_*>,_std::allocator<std::pair<wasm::LocalSet_*const,_std::unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>_>_>_>
  ::operator[](setInfluences,(key_type *)&setInfluences_local);
  pvVar4 = std::
           vector<std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>,_std::allocator<std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>_>_>
           ::operator[](&this->getsByIndex,(ulong)uVar1);
  __end2_2 = std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>::begin(pvVar4);
  get_1 = (LocalGet *)std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>::end(pvVar4);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end2_2,
                       (__normal_iterator<wasm::LocalGet_**,_std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>_>
                        *)&get_1);
    if (!bVar2) break;
    ppLVar7 = __gnu_cxx::
              __normal_iterator<wasm::LocalGet_**,_std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>_>
              ::operator*(&__end2_2);
    __range3 = (mapped_type *)*ppLVar7;
    this_01 = &std::
               unordered_map<wasm::LocalGet_*,_wasm::SmallSet<wasm::LocalSet_*,_2UL>,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>_>_>
               ::operator[](this->getSetsMap,(key_type *)&__range3)->
               super_SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
    ;
    SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
    ::begin((Iterator *)&__end3.flexibleIterator,this_01);
    SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
    ::end((Iterator *)&set_2,this_01);
    while( true ) {
      bVar2 = SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
              ::
              IteratorBase<wasm::SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>,_std::_Rb_tree_const_iterator<wasm::LocalSet_*>_>
              ::operator!=((IteratorBase<wasm::SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>,_std::_Rb_tree_const_iterator<wasm::LocalSet_*>_>
                            *)&__end3.flexibleIterator,(Iterator *)&set_2);
      if (!bVar2) break;
      ppLVar8 = SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
                ::
                IteratorBase<wasm::SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>,_std::_Rb_tree_const_iterator<wasm::LocalSet_*>_>
                ::operator*((IteratorBase<wasm::SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>,_std::_Rb_tree_const_iterator<wasm::LocalSet_*>_>
                             *)&__end3.flexibleIterator);
      local_d8 = *ppLVar8;
      this_02 = std::
                unordered_map<wasm::LocalSet_*,_std::unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>,_std::hash<wasm::LocalSet_*>,_std::equal_to<wasm::LocalSet_*>,_std::allocator<std::pair<wasm::LocalSet_*const,_std::unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>_>_>_>
                ::operator[](setInfluences,&local_d8);
      std::
      unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>
      ::insert(this_02,(value_type *)&__range3);
      SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
      ::
      IteratorBase<wasm::SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>,_std::_Rb_tree_const_iterator<wasm::LocalSet_*>_>
      ::operator++((IteratorBase<wasm::SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>,_std::_Rb_tree_const_iterator<wasm::LocalSet_*>_>
                    *)&__end3.flexibleIterator);
    }
    __gnu_cxx::
    __normal_iterator<wasm::LocalGet_**,_std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>_>
    ::operator++(&__end2_2);
  }
  return;
}

Assistant:

void computeSetInfluences(LocalSet* set,
                            LocalGraphBase::SetInfluencesMap& setInfluences) {
    auto index = set->index;

    // We must never repeat work.
    assert(!setInfluences.count(set));

    // In theory we could flow the set forward, but to keep things simple we
    // reuse the logic for flowing gets backwards: We flow all the gets of the
    // set's index, thus fully computing that index and all its sets, including
    // this one. This is not 100% lazy, but still avoids extra work by never
    // doing work for local indexes we don't care about.
    for (auto* get : getsByIndex[index]) {
      // Don't repeat work.
      if (!getSetsMap.count(get)) {
        computeGetSets(get);
      }
    }

    // Ensure empty entries for each set of this index, to mark them as
    // computed.
    for (auto* set : setsByIndex[index]) {
      setInfluences[set];
    }

    // Also ensure |set| itself, that we were originally asked about. It may be
    // in unreachable code, which means it is not listed in setsByIndex.
    setInfluences[set];

    // Apply the info from the gets to the sets.
    for (auto* get : getsByIndex[index]) {
      for (auto* set : getSetsMap[get]) {
        setInfluences[set].insert(get);
      }
    }
  }